

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::Map(Map *this,Map *toCopy)

{
  string *this_00;
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *this_01;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_02;
  Map *toCopy_local;
  Map *this_local;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00);
  this->pMapTitle = this_00;
  this_01 = (vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *)operator_new(0x18);
  std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>::vector(this_01);
  this->pMapContinents = this_01;
  this_02 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector(this_02);
  this->pMapCountries = this_02;
  std::__cxx11::string::operator=((string *)this->pMapTitle,(string *)toCopy->pMapTitle);
  std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>::operator=
            (this->pMapContinents,toCopy->pMapContinents);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::operator=
            (this->pMapCountries,toCopy->pMapCountries);
  return;
}

Assistant:

Map::Map(const Map& toCopy) {
    pMapTitle = new string();
    pMapContinents = new vector<Continent*>;
    pMapCountries = new vector<Country*>;
    *pMapTitle = *toCopy.pMapTitle;
    *pMapContinents = *toCopy.pMapContinents;
    *pMapCountries = *toCopy.pMapCountries;
}